

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O3

ObjectSplit * __thiscall
embree::avx::
HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_object_find
          (ObjectSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize,SplitInfo *info)

{
  int *piVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  PrimRef *pPVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  size_t sVar17;
  int iVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  uint *puVar23;
  ulong uVar24;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar25;
  long unaff_R13;
  long lVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  float fVar28;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar29 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ObjectBinner binner;
  vuint4 rCounts [32];
  vfloat4 rAreas [32];
  undefined8 local_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [3] [16];
  undefined1 local_1290 [16];
  undefined8 local_1280 [2];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [2976];
  undefined1 auStack_690 [16];
  uint local_680 [2];
  undefined8 auStack_678 [61];
  undefined1 auStack_490 [32];
  undefined1 auStack_470 [480];
  undefined8 uStack_290;
  float afStack_288 [6];
  float afStack_270 [144];
  
  lVar13 = 0xc00;
  pauVar22 = (undefined1 (*) [16])local_1230;
  auVar34._8_4_ = 0x7f800000;
  auVar34._0_8_ = 0x7f8000007f800000;
  auVar34._12_4_ = 0x7f800000;
  auVar38._8_4_ = 0xff800000;
  auVar38._0_8_ = 0xff800000ff800000;
  auVar38._12_4_ = 0xff800000;
  do {
    pauVar22[-1] = auVar34;
    *pauVar22 = auVar38;
    pauVar22[-3] = auVar34;
    pauVar22[-2] = auVar38;
    pauVar22[-5] = auVar34;
    pauVar22[-4] = auVar38;
    *(undefined8 *)((long)local_1280 + lVar13) = 0;
    *(undefined8 *)((long)local_1280 + lVar13 + 8) = 0;
    lVar13 = lVar13 + 0x10;
    pauVar22 = pauVar22 + 6;
  } while (lVar13 != 0xe00);
  uVar8 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  uVar9 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  fVar28 = (float)(uVar8 - uVar9) * 0.05 + 4.0;
  uVar14 = (ulong)fVar28;
  uVar14 = (long)(fVar28 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14;
  uVar24 = 0x20;
  if (uVar14 < 0x20) {
    uVar24 = uVar14;
  }
  auVar3 = *(undefined1 (*) [16])(set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128;
  auVar43 = vsubps_avx((undefined1  [16])(set->super_CentGeomBBox3fa).centBounds.upper.field_0,
                       auVar3);
  auVar41._8_4_ = 0x704ec3d;
  auVar41._0_8_ = 0x704ec3d0704ec3d;
  auVar41._12_4_ = 0x704ec3d;
  auVar46 = vmaxps_avx(auVar41,auVar43);
  auVar43 = vcmpps_avx(auVar46,auVar41,6);
  auVar41 = vshufps_avx(ZEXT416((uint)((float)(long)uVar24 * 0.99)),
                        ZEXT416((uint)((float)(long)uVar24 * 0.99)),0);
  auVar46 = vdivps_avx(auVar41,auVar46);
  local_1290 = vandps_avx(auVar43,auVar46);
  uVar20 = uVar8 - uVar9;
  if (uVar20 != 0) {
    pPVar10 = this->prims0;
    fVar28 = local_1290._0_4_;
    fVar31 = local_1290._4_4_;
    fVar32 = local_1290._8_4_;
    fVar33 = local_1290._12_4_;
    if (uVar20 == 1) {
      uVar21 = 0;
    }
    else {
      auVar43 = vpshufd_avx(ZEXT416((int)uVar24 - 1),0);
      paVar25 = &pPVar10[uVar9 + 1].upper.field_0;
      uVar21 = 0;
      do {
        aVar4 = paVar25[-3].field_1;
        aVar5 = paVar25[-2].field_1;
        auVar46._0_4_ = aVar4.x + aVar5.x;
        auVar46._4_4_ = aVar4.y + aVar5.y;
        auVar46._8_4_ = aVar4.z + aVar5.z;
        auVar46._12_4_ = aVar4.field_3.w + aVar5.field_3.w;
        aVar6 = paVar25[-1].field_1;
        auVar46 = vsubps_avx(auVar46,auVar3);
        auVar47._0_4_ = fVar28 * auVar46._0_4_;
        auVar47._4_4_ = fVar31 * auVar46._4_4_;
        auVar47._8_4_ = fVar32 * auVar46._8_4_;
        auVar47._12_4_ = fVar33 * auVar46._12_4_;
        auVar46 = vroundps_avx(auVar47,1);
        aVar7 = paVar25->field_1;
        auVar46 = vcvtps2dq_avx(auVar46);
        auVar46 = vpminsd_avx(auVar46,auVar43);
        auVar47 = vpmaxsd_avx(auVar46,ZEXT816(0) << 0x20);
        auVar48._0_4_ = aVar6.x + aVar7.x;
        auVar48._4_4_ = aVar6.y + aVar7.y;
        auVar48._8_4_ = aVar6.z + aVar7.z;
        auVar48._12_4_ = aVar6.field_3.w + aVar7.field_3.w;
        auVar46 = vsubps_avx(auVar48,auVar3);
        auVar49._0_4_ = auVar46._0_4_ * fVar28;
        auVar49._4_4_ = auVar46._4_4_ * fVar31;
        auVar49._8_4_ = auVar46._8_4_ * fVar32;
        auVar49._12_4_ = auVar46._12_4_ * fVar33;
        auVar46 = vroundps_avx(auVar49,1);
        auVar46 = vcvtps2dq_avx(auVar46);
        auVar46 = vpminsd_avx(auVar46,auVar43);
        lVar15 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),auVar47._0_4_);
        auVar48 = vpmaxsd_avx(auVar46,ZEXT816(0) << 0x20);
        auVar41 = vminps_avx(*(undefined1 (*) [16])(local_1280 + lVar15 * 0xc),
                             (undefined1  [16])aVar4);
        auVar46 = vmaxps_avx(*(undefined1 (*) [16])(local_1270 + lVar15 * 0x60),
                             (undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_1280 + lVar15 * 0xc) = auVar41;
        *(undefined1 (*) [16])(local_1270 + lVar15 * 0x60) = auVar46;
        lVar13 = (ulong)auVar47._4_4_ * 0x60;
        auVar41 = vminps_avx(*(undefined1 (*) [16])(local_1260 + lVar13),(undefined1  [16])aVar4);
        auVar46 = vmaxps_avx(*(undefined1 (*) [16])(local_1250 + lVar13),(undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_1260 + lVar13) = auVar41;
        *(undefined1 (*) [16])(local_1250 + lVar13) = auVar46;
        lVar13 = (ulong)auVar47._8_4_ * 0x60;
        auVar46 = vminps_avx(*(undefined1 (*) [16])(local_1240 + lVar13),(undefined1  [16])aVar4);
        *(undefined1 (*) [16])(local_1240 + lVar13) = auVar46;
        auVar46 = vmaxps_avx(*(undefined1 (*) [16])(local_1230 + lVar13),(undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_1230 + lVar13) = auVar46;
        *(int *)(auStack_678 + lVar15 * 2 + -1) = *(int *)(auStack_678 + lVar15 * 2 + -1) + 1;
        piVar1 = (int *)((long)auStack_678 + (ulong)auVar47._4_4_ * 0x10 + -4);
        *piVar1 = *piVar1 + 1;
        lVar15 = CONCAT44((int)((ulong)(lVar15 * 0x10) >> 0x20),auVar48._0_4_);
        *(int *)(auStack_678 + (ulong)auVar47._8_4_ * 2) =
             *(int *)(auStack_678 + (ulong)auVar47._8_4_ * 2) + 1;
        auVar46 = *(undefined1 (*) [16])(local_1270 + lVar15 * 0x60);
        auVar41 = vminps_avx(*(undefined1 (*) [16])(local_1280 + lVar15 * 0xc),
                             (undefined1  [16])aVar6);
        *(undefined1 (*) [16])(local_1280 + lVar15 * 0xc) = auVar41;
        auVar46 = vmaxps_avx(auVar46,(undefined1  [16])aVar7);
        lVar13 = (ulong)auVar48._4_4_ * 0x60;
        *(undefined1 (*) [16])(local_1270 + lVar15 * 0x60) = auVar46;
        auVar46 = vminps_avx(*(undefined1 (*) [16])(local_1260 + lVar13),(undefined1  [16])aVar6);
        *(undefined1 (*) [16])(local_1260 + lVar13) = auVar46;
        auVar46 = vmaxps_avx(*(undefined1 (*) [16])(local_1250 + lVar13),(undefined1  [16])aVar7);
        *(undefined1 (*) [16])(local_1250 + lVar13) = auVar46;
        lVar13 = (ulong)auVar48._8_4_ * 0x60;
        auVar46 = vminps_avx(*(undefined1 (*) [16])(local_1240 + lVar13),(undefined1  [16])aVar6);
        *(undefined1 (*) [16])(local_1240 + lVar13) = auVar46;
        auVar46 = vmaxps_avx(*(undefined1 (*) [16])(local_1230 + lVar13),(undefined1  [16])aVar7);
        *(undefined1 (*) [16])(local_1230 + lVar13) = auVar46;
        unaff_R13 = lVar15 * 0x10;
        *(int *)(auStack_678 + lVar15 * 2 + -1) = *(int *)(auStack_678 + lVar15 * 2 + -1) + 1;
        piVar1 = (int *)((long)auStack_678 + (ulong)auVar48._4_4_ * 0x10 + -4);
        *piVar1 = *piVar1 + 1;
        *(int *)(auStack_678 + (ulong)auVar48._8_4_ * 2) =
             *(int *)(auStack_678 + (ulong)auVar48._8_4_ * 2) + 1;
        uVar21 = uVar21 + 2;
        paVar25 = paVar25 + 4;
      } while (uVar21 < uVar20 - 1);
    }
    if (uVar21 < uVar20) {
      aVar4 = pPVar10[uVar9 + uVar21].lower.field_0.field_1;
      aVar5 = pPVar10[uVar9 + uVar21].upper.field_0.field_1;
      auVar43._0_4_ = aVar4.x + aVar5.x;
      auVar43._4_4_ = aVar4.y + aVar5.y;
      auVar43._8_4_ = aVar4.z + aVar5.z;
      auVar43._12_4_ = aVar4.field_3.w + aVar5.field_3.w;
      auVar43 = vsubps_avx(auVar43,auVar3);
      auVar44._0_4_ = fVar28 * auVar43._0_4_;
      auVar44._4_4_ = fVar31 * auVar43._4_4_;
      auVar44._8_4_ = fVar32 * auVar43._8_4_;
      auVar44._12_4_ = fVar33 * auVar43._12_4_;
      auVar43 = vroundps_avx(auVar44,1);
      auVar43 = vcvtps2dq_avx(auVar43);
      auVar46 = vpshufd_avx(ZEXT416((int)uVar24 - 1),0);
      auVar43 = vpminsd_avx(auVar43,auVar46);
      auVar41 = vpmaxsd_avx(auVar43,(undefined1  [16])0x0);
      uVar20 = (ulong)auVar41._0_4_;
      *(int *)(auStack_678 + uVar20 * 2 + -1) = *(int *)(auStack_678 + uVar20 * 2 + -1) + 1;
      auVar43 = *(undefined1 (*) [16])(local_1270 + uVar20 * 0x60);
      auVar46 = vminps_avx(*(undefined1 (*) [16])(local_1280 + uVar20 * 0xc),(undefined1  [16])aVar4
                          );
      *(undefined1 (*) [16])(local_1280 + uVar20 * 0xc) = auVar46;
      auVar43 = vmaxps_avx(auVar43,(undefined1  [16])aVar5);
      *(undefined1 (*) [16])(local_1270 + uVar20 * 0x60) = auVar43;
      piVar1 = (int *)((long)auStack_678 + (ulong)auVar41._4_4_ * 0x10 + -4);
      *piVar1 = *piVar1 + 1;
      lVar13 = (ulong)auVar41._4_4_ * 0x60;
      auVar43 = vminps_avx(*(undefined1 (*) [16])(local_1260 + lVar13),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1260 + lVar13) = auVar43;
      auVar43 = vmaxps_avx(*(undefined1 (*) [16])(local_1250 + lVar13),(undefined1  [16])aVar5);
      *(undefined1 (*) [16])(local_1250 + lVar13) = auVar43;
      *(int *)(auStack_678 + (ulong)auVar41._8_4_ * 2) =
           *(int *)(auStack_678 + (ulong)auVar41._8_4_ * 2) + 1;
      lVar13 = (ulong)auVar41._8_4_ * 0x60;
      auVar43 = vminps_avx(*(undefined1 (*) [16])(local_1240 + lVar13),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1240 + lVar13) = auVar43;
      auVar43 = vmaxps_avx(*(undefined1 (*) [16])(local_1230 + lVar13),(undefined1  [16])aVar5);
      *(undefined1 (*) [16])(local_1230 + lVar13) = auVar43;
    }
  }
  lVar13 = uVar24 - 1;
  if (lVar13 != 0) {
    lVar15 = uVar24 * 0x10;
    pauVar22 = (undefined1 (*) [16])(local_1290 + uVar24 * 0x60);
    auVar42 = ZEXT1664((undefined1  [16])0x0);
    lVar26 = 0;
    auVar47 = auVar34;
    auVar41 = auVar34;
    auVar46 = auVar38;
    auVar43 = auVar38;
    do {
      auVar48 = vpaddd_avx(auVar42._0_16_,*(undefined1 (*) [16])(auStack_690 + lVar26 + lVar15));
      auVar42 = ZEXT1664(auVar48);
      auVar34 = vminps_avx(auVar34,pauVar22[-5]);
      auVar43 = vmaxps_avx(auVar43,pauVar22[-4]);
      *(undefined1 (*) [16])(auStack_490 + lVar26 + lVar15) = auVar48;
      auVar44 = vsubps_avx(auVar43,auVar34);
      auVar41 = vminps_avx(auVar41,pauVar22[-3]);
      auVar38 = vmaxps_avx(auVar38,pauVar22[-2]);
      auVar51 = vsubps_avx(auVar38,auVar41);
      auVar48 = vinsertps_avx(auVar51,auVar44,0x4c);
      auVar49 = vshufpd_avx(auVar44,auVar44,1);
      auVar49 = vinsertps_avx(auVar49,auVar51,0x9c);
      auVar44 = vunpcklps_avx(auVar44,auVar51);
      auVar51._0_4_ =
           auVar44._0_4_ * (auVar48._0_4_ + auVar49._0_4_) + auVar48._0_4_ * auVar49._0_4_;
      auVar51._4_4_ =
           auVar44._4_4_ * (auVar48._4_4_ + auVar49._4_4_) + auVar48._4_4_ * auVar49._4_4_;
      auVar51._8_4_ =
           auVar44._8_4_ * (auVar48._8_4_ + auVar49._8_4_) + auVar48._8_4_ * auVar49._8_4_;
      auVar51._12_4_ =
           auVar44._12_4_ * (auVar48._12_4_ + auVar49._12_4_) + auVar48._12_4_ * auVar49._12_4_;
      uVar2 = vmovlps_avx(auVar51);
      *(undefined8 *)((long)&uStack_290 + lVar26 + lVar15) = uVar2;
      auVar47 = vminps_avx(auVar47,pauVar22[-1]);
      auVar46 = vmaxps_avx(auVar46,*pauVar22);
      auVar44 = vsubps_avx(auVar46,auVar47);
      auVar48 = vmovshdup_avx(auVar44);
      auVar49 = vshufpd_avx(auVar44,auVar44,1);
      *(float *)((long)afStack_288 + lVar26 + lVar15) =
           auVar44._0_4_ * (auVar48._0_4_ + auVar49._0_4_) + auVar48._0_4_ * auVar49._0_4_;
      *(undefined4 *)((long)afStack_288 + lVar26 + lVar15 + 4) = 0;
      lVar26 = lVar26 + -0x10;
      pauVar22 = pauVar22 + -6;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  uVar20 = 0xffffffff;
  if (uVar14 < 2) {
    local_12c0[0]._8_4_ = 0x7f800000;
    local_12c0[0]._0_8_ = 0x7f8000007f800000;
    local_12c0[0]._12_4_ = 0x7f800000;
    local_12d0 = (undefined1  [16])0x0;
  }
  else {
    auVar47 = vpshufd_avx(ZEXT416((uint)~(-1 << ((byte)logBlockSize & 0x1f))),0);
    pauVar22 = (undefined1 (*) [16])local_1230;
    auVar42 = ZEXT1664((undefined1  [16])0x0);
    auVar35._8_8_ = 0x100000001;
    auVar35._0_8_ = 0x100000001;
    auVar39._8_4_ = 0x7f800000;
    auVar39._0_8_ = 0x7f8000007f800000;
    auVar39._12_4_ = 0x7f800000;
    auVar45._8_4_ = 0xff800000;
    auVar45._0_8_ = 0xff800000ff800000;
    auVar45._12_4_ = 0xff800000;
    auVar41 = ZEXT816(0) << 0x40;
    lVar13 = 0;
    auVar38 = auVar45;
    auVar46 = auVar39;
    auVar34 = auVar45;
    local_12c0[0] = auVar39;
    auVar43 = auVar39;
    do {
      auVar43 = vminps_avx(auVar43,pauVar22[-5]);
      auVar45 = vmaxps_avx(auVar45,pauVar22[-4]);
      auVar46 = vminps_avx(auVar46,pauVar22[-3]);
      auVar38 = vmaxps_avx(auVar38,pauVar22[-2]);
      auVar44 = vsubps_avx(auVar45,auVar43);
      auVar12 = vsubps_avx(auVar38,auVar46);
      auVar39 = vminps_avx(auVar39,pauVar22[-1]);
      auVar34 = vmaxps_avx(auVar34,*pauVar22);
      auVar50 = vsubps_avx(auVar34,auVar39);
      auVar48 = vshufps_avx(auVar44,auVar50,0x65);
      auVar48 = vblendps_avx(auVar48,auVar12,2);
      auVar49 = vshufps_avx(auVar44,auVar50,0x96);
      auVar51 = vinsertps_avx(auVar49,auVar12,0x90);
      auVar49 = vshufps_avx(auVar44,auVar50,0);
      auVar41 = vpaddd_avx(auVar41,*(undefined1 (*) [16])((long)auStack_678 + lVar13 + -8));
      auVar12 = vinsertps_avx(auVar49,auVar12,0x10);
      auVar49 = vpaddd_avx(auVar41,auVar47);
      auVar49 = vpsrld_avx(auVar49,ZEXT416((uint)logBlockSize));
      auVar44 = vpaddd_avx(auVar47,*(undefined1 (*) [16])(auStack_470 + lVar13));
      auVar50 = vpsrad_avx(auVar49,0x1f);
      auVar11._8_8_ = 0x4f0000004f000000;
      auVar11._0_8_ = 0x4f0000004f000000;
      auVar50 = vpand_avx(auVar50,auVar11);
      auVar36._8_4_ = 0x7fffffff;
      auVar36._0_8_ = 0x7fffffff7fffffff;
      auVar36._12_4_ = 0x7fffffff;
      auVar49 = vpand_avx(auVar49,auVar36);
      auVar49 = vcvtdq2ps_avx(auVar49);
      auVar44 = vpsrld_avx(auVar44,ZEXT416((uint)logBlockSize));
      auVar29 = vpsrad_avx(auVar44,0x1f);
      auVar11 = vpand_avx(auVar11,auVar29);
      auVar44 = vpand_avx(auVar44,auVar36);
      auVar44 = vcvtdq2ps_avx(auVar44);
      auVar29._0_4_ =
           ((auVar51._0_4_ + auVar48._0_4_) * auVar12._0_4_ + auVar51._0_4_ * auVar48._0_4_) *
           (auVar50._0_4_ + auVar49._0_4_) +
           (auVar44._0_4_ + auVar11._0_4_) * *(float *)((long)afStack_270 + lVar13);
      auVar29._4_4_ =
           ((auVar51._4_4_ + auVar48._4_4_) * auVar12._4_4_ + auVar51._4_4_ * auVar48._4_4_) *
           (auVar50._4_4_ + auVar49._4_4_) +
           (auVar44._4_4_ + auVar11._4_4_) * *(float *)((long)afStack_270 + lVar13 + 4);
      auVar29._8_4_ =
           ((auVar51._8_4_ + auVar48._8_4_) * auVar12._8_4_ + auVar51._8_4_ * auVar48._8_4_) *
           (auVar50._8_4_ + auVar49._8_4_) +
           (auVar44._8_4_ + auVar11._8_4_) * *(float *)((long)afStack_270 + lVar13 + 8);
      auVar29._12_4_ =
           ((auVar51._12_4_ + auVar48._12_4_) * auVar12._12_4_ + auVar51._12_4_ * auVar48._12_4_) *
           (auVar50._12_4_ + auVar49._12_4_) +
           (auVar44._12_4_ + auVar11._12_4_) * *(float *)((long)afStack_270 + lVar13 + 0xc);
      auVar48 = vcmpps_avx(auVar29,local_12c0[0],1);
      local_12d0 = vblendvps_avx(auVar42._0_16_,auVar35,auVar48);
      auVar42 = ZEXT1664(local_12d0);
      local_12c0[0] = vminps_avx(auVar29,local_12c0[0]);
      auVar35 = vpsubd_avx(auVar35,_DAT_01f7ae20);
      pauVar22 = pauVar22 + 6;
      lVar13 = lVar13 + 0x10;
    } while (uVar24 * 0x10 + -0x10 != lVar13);
  }
  fVar28 = INFINITY;
  uVar14 = 0;
  iVar16 = 0;
  local_12f0 = local_1290._0_8_;
  uStack_12e8 = local_1290._8_8_;
  do {
    if ((((*(float *)(local_1290 + uVar14 * 4) != 0.0) || (NAN(*(float *)(local_1290 + uVar14 * 4)))
         ) && (*(float *)(local_12c0[0] + uVar14 * 4) < fVar28)) &&
       (*(int *)(local_12d0 + uVar14 * 4) != 0)) {
      uVar20 = uVar14 & 0xffffffff;
      iVar16 = *(int *)(local_12d0 + uVar14 * 4);
      fVar28 = *(float *)(local_12c0[0] + uVar14 * 4);
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 3);
  __return_storage_ptr__->sah = fVar28;
  iVar18 = (int)uVar20;
  __return_storage_ptr__->dim = iVar18;
  (__return_storage_ptr__->field_2).pos = iVar16;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = uVar24;
  local_12e0 = auVar3._0_8_;
  uStack_12d8 = auVar3._8_8_;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = local_12e0;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uStack_12d8;
  *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 = local_12f0;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = uStack_12e8;
  if (iVar18 == -1) {
    info->leftCount = SUB168(ZEXT816(0) << 0x20,0);
    info->rightCount = SUB168(ZEXT816(0) << 0x20,8);
    aVar27.m128[2] = INFINITY;
    aVar27._0_8_ = 0x7f8000007f800000;
    aVar27.m128[3] = INFINITY;
    (info->leftBounds).lower.field_0 = aVar27;
    aVar37.m128[2] = -INFINITY;
    aVar37._0_8_ = 0xff800000ff800000;
    aVar37.m128[3] = -INFINITY;
    aVar30 = aVar37;
  }
  else {
    uVar14 = (ulong)iVar16;
    aVar30.m128[2] = -INFINITY;
    aVar30._0_8_ = 0xff800000ff800000;
    aVar30.m128[3] = -INFINITY;
    aVar27.m128[2] = INFINITY;
    aVar27._0_8_ = 0x7f8000007f800000;
    aVar27.m128[3] = INFINITY;
    lVar13 = (long)iVar18;
    if (iVar16 == 0) {
      sVar17 = 0;
      aVar40 = aVar27;
      aVar37 = aVar30;
    }
    else {
      puVar23 = (uint *)((long)auStack_678 + lVar13 * 4 + -8);
      pauVar22 = (undefined1 (*) [16])(local_1270 + lVar13 * 0x20);
      aVar40.m128[2] = INFINITY;
      aVar40._0_8_ = 0x7f8000007f800000;
      aVar40.m128[3] = INFINITY;
      aVar37.m128[2] = -INFINITY;
      aVar37._0_8_ = 0xff800000ff800000;
      aVar37.m128[3] = -INFINITY;
      sVar17 = 0;
      uVar20 = uVar14;
      do {
        aVar40.m128 = (__m128)vminps_avx(aVar40.m128,pauVar22[-1]);
        aVar37.m128 = (__m128)vmaxps_avx(aVar37.m128,*pauVar22);
        sVar17 = sVar17 + *puVar23;
        puVar23 = puVar23 + 4;
        pauVar22 = pauVar22 + 6;
        uVar20 = uVar20 - 1;
      } while (uVar20 != 0);
    }
    lVar15 = uVar24 - uVar14;
    if (uVar24 < uVar14 || lVar15 == 0) {
      sVar19 = 0;
    }
    else {
      puVar23 = (uint *)((long)auStack_678 + uVar14 * 0x10 + lVar13 * 4 + -8);
      pauVar22 = (undefined1 (*) [16])(local_1270 + lVar13 * 0x20 + uVar14 * 0x60);
      aVar27.m128[2] = INFINITY;
      aVar27._0_8_ = 0x7f8000007f800000;
      aVar27.m128[3] = INFINITY;
      aVar30.m128[2] = -INFINITY;
      aVar30._0_8_ = 0xff800000ff800000;
      aVar30.m128[3] = -INFINITY;
      sVar19 = 0;
      do {
        aVar27.m128 = (__m128)vminps_avx(aVar27.m128,pauVar22[-1]);
        aVar30.m128 = (__m128)vmaxps_avx(aVar30.m128,*pauVar22);
        sVar19 = sVar19 + *puVar23;
        puVar23 = puVar23 + 4;
        pauVar22 = pauVar22 + 6;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
    info->leftCount = sVar17;
    info->rightCount = sVar19;
    (info->leftBounds).lower.field_0 = aVar40;
  }
  (info->leftBounds).upper.field_0 = aVar37;
  (info->rightBounds).lower.field_0 = aVar27;
  (info->rightBounds).upper.field_0 = aVar30;
  return __return_storage_ptr__;
}

Assistant:

sequential_object_find(const PrimInfoExtRange& set, const size_t logBlockSize, SplitInfo &info)
        {
          ObjectBinner binner(empty); 
          const BinMapping<OBJECT_BINS> mapping(set);
          binner.bin(prims0,set.begin(),set.end(),mapping);
          ObjectSplit s = binner.best(mapping,logBlockSize);
          binner.getSplitInfo(mapping, s, info);
          return s;
        }